

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Triple.cpp
# Opt level: O0

ObjectFormatType parseFormat(StringRef EnvironmentName)

{
  bool bVar1;
  ObjectFormatType *pOVar2;
  StringLiteral local_248;
  StringLiteral local_238;
  StringLiteral local_228;
  StringLiteral local_218;
  char *local_208;
  char *local_200;
  StringRef local_1f8;
  Optional<llvm::Triple::ObjectFormatType> OStack_1e8;
  char *local_1e0;
  StringRef EnvironmentName_local;
  ObjectFormatType local_1a4;
  StringRef *local_1a0;
  char *local_198;
  char *local_190;
  StringRef *local_188;
  char *local_180;
  char *local_178;
  char *local_170;
  char *local_168;
  iterator local_160;
  int local_154;
  char *local_150;
  char *local_148;
  ObjectFormatType local_13c;
  StringRef *local_138;
  char *local_130;
  char *local_128;
  StringRef *local_120;
  char *local_118;
  char *local_110;
  char *local_108;
  char *local_100;
  iterator local_f8;
  int local_ec;
  char *local_e8;
  char *local_e0;
  ObjectFormatType local_d4;
  StringRef *local_d0;
  char *local_c8;
  char *local_c0;
  StringRef *local_b8;
  char *local_b0;
  char *local_a8;
  char *local_a0;
  char *local_98;
  iterator local_90;
  int local_84;
  char *local_80;
  char *local_78;
  ObjectFormatType local_6c;
  StringRef *local_68;
  char *local_60;
  char *local_58;
  StringRef *local_50;
  char *local_48;
  char *local_40;
  char *local_38;
  char *local_30;
  iterator local_28;
  int local_20;
  ObjectFormatType local_1c;
  StringRef *local_18;
  ObjectFormatType local_c;
  
  local_200 = (char *)EnvironmentName.Length;
  local_208 = EnvironmentName.Data;
  EnvironmentName_local.Length = (size_t)&local_1f8;
  local_1e0 = local_208;
  EnvironmentName_local.Data = local_200;
  local_1f8.Data = local_208;
  local_1f8.Length = (size_t)local_200;
  llvm::Optional<llvm::Triple::ObjectFormatType>::Optional(&OStack_1e8);
  llvm::StringLiteral::StringLiteral<5UL>(&local_218,(char (*) [5])"coff");
  local_60 = local_218.super_StringRef.Data;
  local_58 = (char *)local_218.super_StringRef.Length;
  local_6c = COFF;
  local_68 = &local_1f8;
  bVar1 = llvm::Optional::operator_cast_to_bool((Optional *)&OStack_1e8);
  if (!bVar1) {
    local_80 = local_60;
    local_78 = local_58;
    local_48 = local_60;
    local_40 = local_58;
    bVar1 = false;
    local_50 = &local_1f8;
    if (local_58 <= local_1f8.Length) {
      local_28 = llvm::StringRef::end(&local_1f8);
      local_28 = local_28 + -(long)local_40;
      local_30 = local_48;
      local_38 = local_40;
      if (local_40 == (char *)0x0) {
        local_20 = 0;
      }
      else {
        local_20 = memcmp(local_28,local_48,(size_t)local_40);
      }
      bVar1 = local_20 == 0;
    }
    if (bVar1) {
      llvm::Optional<llvm::Triple::ObjectFormatType>::operator=(&OStack_1e8,&local_6c);
    }
  }
  llvm::StringLiteral::StringLiteral<4UL>(&local_228,(char (*) [4])"elf");
  local_c8 = local_228.super_StringRef.Data;
  local_c0 = (char *)local_228.super_StringRef.Length;
  local_d4 = ELF;
  local_d0 = &local_1f8;
  bVar1 = llvm::Optional::operator_cast_to_bool((Optional *)&OStack_1e8);
  if (!bVar1) {
    local_e8 = local_c8;
    local_e0 = local_c0;
    local_b0 = local_c8;
    local_a8 = local_c0;
    bVar1 = false;
    local_b8 = &local_1f8;
    if (local_c0 <= local_1f8.Length) {
      local_90 = llvm::StringRef::end(&local_1f8);
      local_90 = local_90 + -(long)local_a8;
      local_98 = local_b0;
      local_a0 = local_a8;
      if (local_a8 == (char *)0x0) {
        local_84 = 0;
      }
      else {
        local_84 = memcmp(local_90,local_b0,(size_t)local_a8);
      }
      bVar1 = local_84 == 0;
    }
    if (bVar1) {
      llvm::Optional<llvm::Triple::ObjectFormatType>::operator=(&OStack_1e8,&local_d4);
    }
  }
  llvm::StringLiteral::StringLiteral<6UL>(&local_238,(char (*) [6])"macho");
  local_130 = local_238.super_StringRef.Data;
  local_128 = (char *)local_238.super_StringRef.Length;
  local_13c = MachO;
  local_138 = &local_1f8;
  bVar1 = llvm::Optional::operator_cast_to_bool((Optional *)&OStack_1e8);
  if (!bVar1) {
    local_150 = local_130;
    local_148 = local_128;
    local_118 = local_130;
    local_110 = local_128;
    bVar1 = false;
    local_120 = &local_1f8;
    if (local_128 <= local_1f8.Length) {
      local_f8 = llvm::StringRef::end(&local_1f8);
      local_f8 = local_f8 + -(long)local_110;
      local_100 = local_118;
      local_108 = local_110;
      if (local_110 == (char *)0x0) {
        local_ec = 0;
      }
      else {
        local_ec = memcmp(local_f8,local_118,(size_t)local_110);
      }
      bVar1 = local_ec == 0;
    }
    if (bVar1) {
      llvm::Optional<llvm::Triple::ObjectFormatType>::operator=(&OStack_1e8,&local_13c);
    }
  }
  llvm::StringLiteral::StringLiteral<5UL>(&local_248,(char (*) [5])"wasm");
  local_198 = local_248.super_StringRef.Data;
  local_190 = (char *)local_248.super_StringRef.Length;
  local_1a4 = Wasm;
  local_1a0 = &local_1f8;
  bVar1 = llvm::Optional::operator_cast_to_bool((Optional *)&OStack_1e8);
  if (!bVar1) {
    local_180 = local_198;
    local_178 = local_190;
    bVar1 = false;
    local_188 = &local_1f8;
    if (local_190 <= local_1f8.Length) {
      local_160 = llvm::StringRef::end(&local_1f8);
      local_160 = local_160 + -(long)local_178;
      local_168 = local_180;
      local_170 = local_178;
      if (local_178 == (char *)0x0) {
        local_154 = 0;
      }
      else {
        local_154 = memcmp(local_160,local_180,(size_t)local_178);
      }
      bVar1 = local_154 == 0;
    }
    if (bVar1) {
      llvm::Optional<llvm::Triple::ObjectFormatType>::operator=(&OStack_1e8,&local_1a4);
    }
  }
  local_1c = UnknownObjectFormat;
  local_18 = &local_1f8;
  bVar1 = llvm::Optional::operator_cast_to_bool((Optional *)&OStack_1e8);
  if (bVar1) {
    pOVar2 = llvm::Optional<llvm::Triple::ObjectFormatType>::operator*(&OStack_1e8);
    local_c = *pOVar2;
  }
  else {
    local_c = local_1c;
  }
  return local_c;
}

Assistant:

static Triple::ObjectFormatType parseFormat(StringRef EnvironmentName) {
  return StringSwitch<Triple::ObjectFormatType>(EnvironmentName)
    .EndsWith("coff", Triple::COFF)
    .EndsWith("elf", Triple::ELF)
    .EndsWith("macho", Triple::MachO)
    .EndsWith("wasm", Triple::Wasm)
    .Default(Triple::UnknownObjectFormat);
}